

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O1

void __thiscall
Rml::ElementText::OnPropertyChange(ElementText *this,PropertyIdSet *changed_properties)

{
  float fVar1;
  Colourb CVar2;
  Geometry *pGVar3;
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  *this_00;
  bool bVar4;
  StableVectorIndex SVar5;
  uint uVar6;
  Vertex *vertex;
  ComputedValues *pCVar7;
  pointer pVVar8;
  RenderManager *pRVar9;
  int iVar10;
  Vector<Vertex> *__range4;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  float fVar14;
  Mesh mesh;
  Mesh local_68;
  RenderManager *local_38;
  StableVectorIndex local_30;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  pCVar7 = Element::GetComputedValues(&this->super_Element);
  if ((((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x100000000000) == 0) &&
     ((*(byte *)((long)(changed_properties->defined_ids).super__Base_bitset<2UL>._M_w + 9) & 2) == 0
     )) {
    bVar13 = false;
  }
  else {
    CVar2 = (pCVar7->inherited).color;
    fVar1 = (pCVar7->inherited).opacity;
    fVar14 = (float)((uint)CVar2 >> 0x18) * fVar1;
    iVar10 = (int)fVar14;
    fVar14 = fVar14 / 255.0;
    uVar6 = (uint)((float)((uint)CVar2 & 0xff) * fVar14);
    uVar11 = (uint)((float)((uint)CVar2 >> 8 & 0xff) * fVar14);
    uVar12 = (uint)((float)((uint)CVar2 >> 0x10 & 0xff) * fVar14);
    bVar13 = true;
    if (((this->colour).red == (uchar)uVar6) &&
       (((this->colour).green == (uchar)uVar11 && ((this->colour).blue == (uchar)uVar12)))) {
      bVar13 = (this->colour).alpha != (uchar)iVar10;
    }
    if (bVar13) {
      this->colour = (ColourbPremultiplied)
                     (uVar6 & 0xff | (uVar11 & 0xff) << 8 | (uVar12 & 0xff) << 0x10 | iVar10 << 0x18
                     );
    }
    if ((this->opacity != fVar1) || (NAN(this->opacity) || NAN(fVar1))) {
      this->opacity = fVar1;
      this->font_effects_dirty = true;
      this->field_0x1ec = this->field_0x1ec | 1;
    }
  }
  if ((((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0xf800000000000) == 0)
     && ((*(byte *)((long)(changed_properties->defined_ids).super__Base_bitset<2UL>._M_w + 0xc) & 3)
         == 0)) {
    bVar4 = false;
  }
  else {
    ::std::
    vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
    ::_M_erase_at_end(&this->geometry,
                      (this->geometry).
                      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    this->field_0x1ec = this->field_0x1ec | 1;
    this->font_effects_handle = 0;
    this->font_effects_dirty = true;
    this->font_handle_version = 0;
    bVar4 = true;
  }
  if ((*(byte *)((long)(changed_properties->defined_ids).super__Base_bitset<2UL>._M_w + 9) & 0x40)
      != 0) {
    this->font_effects_dirty = true;
  }
  if (((changed_properties->defined_ids).super__Base_bitset<2UL>._M_w[0] & 0x20000000000000) != 0) {
    uVar6 = *(uint *)&(pCVar7->inherited).field_0x14 >> 0x12;
    this->decoration_property = (TextDecoration)uVar6 & LineThrough;
    pGVar3 = (this->decoration)._M_t.
             super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
             super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
             super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl;
    if ((pGVar3 != (Geometry *)0x0) && ((uVar6 & 3) == 0)) {
      (this->decoration)._M_t.
      super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
      super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl = (Geometry *)0x0;
      ::std::default_delete<Rml::Geometry>::operator()
                ((default_delete<Rml::Geometry> *)&this->decoration,pGVar3);
    }
  }
  if (bVar4) {
    if ((this->field_0x1ec & 2) != 0) {
      Element::DirtyLayout(&this->super_Element);
      return;
    }
  }
  else if (bVar13) {
    this->field_0x1ec = this->field_0x1ec | 1;
    pGVar3 = (this->decoration)._M_t.
             super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
             super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
             super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl;
    if (pGVar3 != (Geometry *)0x0) {
      Geometry::Release(&local_68,pGVar3,ReturnMesh);
      for (pVVar8 = local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar8 != local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                    _M_impl.super__Vector_impl_data._M_finish; pVVar8 = pVVar8 + 1) {
        pVVar8->colour = this->colour;
      }
      pRVar9 = Element::GetRenderManager(&this->super_Element);
      if (pRVar9 != (RenderManager *)0x0) {
        RenderManager::MakeGeometry((RenderManager *)&stack0xffffffffffffffc8,(Mesh *)pRVar9);
        this_00 = &((this->decoration)._M_t.
                    super___uniq_ptr_impl<Rml::Geometry,_std::default_delete<Rml::Geometry>_>._M_t.
                    super__Tuple_impl<0UL,_Rml::Geometry_*,_std::default_delete<Rml::Geometry>_>.
                    super__Head_base<0UL,_Rml::Geometry_*,_false>._M_head_impl)->
                   super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ;
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::ReleaseInDerived(this_00);
        SVar5 = local_30;
        pRVar9 = local_38;
        local_38 = (RenderManager *)0x0;
        this_00->render_manager = pRVar9;
        local_30 = Invalid;
        this_00->resource_handle = SVar5;
        UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
        ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                            *)&stack0xffffffffffffffc8);
      }
      if (local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_68.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.vertices.
                        super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.vertices.
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.vertices.
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void ElementText::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	RMLUI_ZoneScoped;

	Element::OnPropertyChange(changed_properties);

	bool colour_changed = false;
	bool font_face_changed = false;
	auto& computed = GetComputedValues();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::Opacity))
	{
		const float new_opacity = computed.opacity();
		const bool opacity_changed = opacity != new_opacity;

		ColourbPremultiplied new_colour = computed.color().ToPremultiplied(new_opacity);
		colour_changed = colour != new_colour;

		if (colour_changed)
		{
			colour = new_colour;
		}
		if (opacity_changed)
		{
			opacity = new_opacity;
			font_effects_dirty = true;
			geometry_dirty = true;
		}
	}

	if (changed_properties.Contains(PropertyId::FontFamily) ||     //
		changed_properties.Contains(PropertyId::FontWeight) ||     //
		changed_properties.Contains(PropertyId::FontStyle) ||      //
		changed_properties.Contains(PropertyId::FontSize) ||       //
		changed_properties.Contains(PropertyId::LetterSpacing) ||  //
		changed_properties.Contains(PropertyId::RmlUi_Language) || //
		changed_properties.Contains(PropertyId::RmlUi_Direction))
	{
		font_face_changed = true;

		geometry.clear();
		geometry_dirty = true;

		font_effects_handle = 0;
		font_effects_dirty = true;
		font_handle_version = 0;
	}

	if (changed_properties.Contains(PropertyId::FontEffect))
	{
		font_effects_dirty = true;
	}

	if (changed_properties.Contains(PropertyId::TextDecoration))
	{
		decoration_property = computed.text_decoration();
		if (decoration && decoration_property == Style::TextDecoration::None)
			decoration.reset();
	}

	if (font_face_changed)
	{
		// We have to let our document know we need to be regenerated.
		if (dirty_layout_on_change)
			DirtyLayout();
	}
	else if (colour_changed)
	{
		// Force the geometry to be regenerated.
		geometry_dirty = true;

		// Re-colour the decoration geometry.
		if (decoration)
		{
			Mesh mesh = decoration->Release();
			for (Vertex& vertex : mesh.vertices)
				vertex.colour = colour;

			if (RenderManager* render_manager = GetRenderManager())
				*decoration = render_manager->MakeGeometry(std::move(mesh));
		}
	}
}